

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  LogEst LVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  Expr *pLimit;
  int n;
  int iOffset;
  int iLimit;
  Vdbe *v;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Expr *p_00;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  p_00 = *(Expr **)(in_RSI + 0x60);
  if ((*(int *)(in_RSI + 0x10) == 0) && (p_00 != (Expr *)0x0)) {
    iVar3 = *(int *)(in_RDI + 0x38) + 1;
    *(int *)(in_RDI + 0x38) = iVar3;
    *(int *)(in_RSI + 0x10) = iVar3;
    sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar2 = sqlite3ExprIsInteger
                      (p_00,(int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar2 == 0) {
      sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (Expr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    }
    else {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
      if (in_stack_ffffffffffffffd4 == 0) {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
      }
      else if (-1 < in_stack_ffffffffffffffd4) {
        in_stack_ffffffffffffffc4 = (int)*(short *)(in_RSI + 10);
        LVar1 = sqlite3LogEst((long)in_stack_ffffffffffffffd4);
        if (LVar1 < in_stack_ffffffffffffffc4) {
          LVar1 = sqlite3LogEst((long)in_stack_ffffffffffffffd4);
          *(LogEst *)(in_RSI + 10) = LVar1;
          *(uint *)(in_RSI + 0xc) = *(uint *)(in_RSI + 0xc) | 0x4000;
        }
      }
    }
    if (p_00->pRight != (Expr *)0x0) {
      iVar2 = *(int *)(in_RDI + 0x38) + 1;
      *(int *)(in_RDI + 0x38) = iVar2;
      *(int *)(in_RSI + 0x14) = iVar2;
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
      sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (Expr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffd4,
                        in_stack_ffffffffffffffd0,(int)((ulong)p_00 >> 0x20),(int)p_00);
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /* 
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}